

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O2

void __thiscall
Js::ProbeContainer::DispatchProbeHandlers(ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  ProbeList *pPVar1;
  List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  int i;
  long lVar5;
  ProbeContainer *local_50;
  HaltCallback *local_48;
  FinallyObject local_40;
  
  bVar2 = CanDispatchHalt(this,pHaltState);
  if (bVar2) {
    local_40.finallyFunc = (anon_class_48_6_9e8417c9 *)&local_50;
    local_40.abnormalTermination = true;
    local_50 = this;
    InitializeLocation(this,pHaltState,true);
    bVar2 = InterpreterHaltState::IsValid(pHaltState);
    if (bVar2) {
      pPVar1 = this->diagProbeList;
      this_00 = this->pendingProbeList;
      for (lVar5 = 0;
          lVar5 < (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>)
                  .count; lVar5 = lVar5 + 1) {
        local_48 = &(pPVar1->
                    super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer
                    [lVar5]->super_HaltCallback;
        iVar3 = (**((HaltCallback *)&local_48->_vptr_HaltCallback)->_vptr_HaltCallback)
                          (local_48,pHaltState);
        if ((char)iVar3 != '\0') {
          JsUtil::
          List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
          Add(this_00,(Probe **)&local_48);
        }
      }
      if ((this_00->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count
          != 0) {
        iVar3 = -1;
        do {
          iVar3 = iVar3 + 1;
          if ((this_00->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              count <= iVar3) break;
          if (this->haltCallbackProbe != (HaltCallback *)0x0) {
            iVar4 = (*this->haltCallbackProbe->_vptr_HaltCallback[3])();
            if ((char)iVar4 == '\0') {
              StepController::Deactivate(&this->debugManager->stepController,pHaltState);
              AsyncBreakController::Deactivate(&this->debugManager->asyncBreakController);
              (*this->haltCallbackProbe->_vptr_HaltCallback[1])(this->haltCallbackProbe,pHaltState);
            }
          }
        } while (this->IsNextStatementChanged == false);
      }
    }
    local_40.abnormalTermination = false;
    anon_func::FinallyObject::~FinallyObject(&local_40);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchProbeHandlers(InterpreterHaltState* pHaltState)
    {
        if (!CanDispatchHalt(pHaltState))
        {
            return;
        }

        TryFinally([&]()
        {
            InitializeLocation(pHaltState);

            if (pHaltState->IsValid())
            {
                Js::ProbeList * localPendingProbeList = this->pendingProbeList;
                diagProbeList->Map([pHaltState, localPendingProbeList](int index, Probe * probe)
                {
                    if (probe->CanHalt(pHaltState))
                    {
                        localPendingProbeList->Add(probe);
                    }
                });

                if (localPendingProbeList->Count() != 0)
                {
                    localPendingProbeList->MapUntil([&](int index, Probe * probe)
                    {
                        if (haltCallbackProbe && !haltCallbackProbe->IsInClosedState())
                        {
                            debugManager->stepController.Deactivate(pHaltState);
                            debugManager->asyncBreakController.Deactivate();
                            haltCallbackProbe->DispatchHalt(pHaltState);
                        }
                        // If SetNextStatement happened between multiple BPs on same location, IP changed so rest of dispatch are not valid.
                        return this->IsSetNextStatementCalled();
                    });
                }
            }
        },
        [&](bool)
        {
            pendingProbeList->Clear();
            DestroyLocation();
        });
    }